

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_includes(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  BOOL BVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  long lVar5;
  JSValueUnion JVar6;
  int64_t iVar7;
  int64_t *piVar8;
  ulong uVar9;
  JSRefCountHeader *p;
  uint uVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue JVar13;
  int64_t len;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  JVar11 = JS_ToObject(ctx,this_val);
  JVar3 = JVar11.u;
  iVar1 = js_get_length64(ctx,(int64_t *)&local_38,JVar11);
  uVar10 = (uint)JVar11.tag;
  if (iVar1 == 0) {
    local_48 = local_38;
    if (0 < (long)local_38) {
      local_50 = 0;
      if ((1 < argc) &&
         (iVar1 = JS_ToInt64Clamp(ctx,(int64_t *)&local_50,argv[1],0,local_38,local_38), iVar1 != 0)
         ) goto LAB_0012c912;
      uVar9 = local_50;
      if ((uVar10 == 0xffffffff) &&
         ((*(short *)((long)JVar3.ptr + 6) == 2 && ((*(byte *)((long)JVar3.ptr + 5) & 8) != 0)))) {
        uVar4 = (ulong)*(uint *)((long)JVar3.ptr + 0x40);
        lVar5 = uVar4 - local_50;
        if (lVar5 != 0 && (long)local_50 <= (long)uVar4) {
          piVar8 = (int64_t *)(local_50 * 0x10 + *(long *)((long)JVar3.ptr + 0x38) + 8);
          local_40 = uVar4;
          do {
            JVar12 = *argv;
            if (0xfffffff4 < (uint)argv->tag) {
              *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
            }
            JVar6 = (JSValueUnion)((JSValueUnion *)(piVar8 + -1))->ptr;
            iVar7 = *piVar8;
            if (0xfffffff4 < (uint)iVar7) {
              *(int *)JVar6.ptr = *JVar6.ptr + 1;
            }
            JVar13.tag = iVar7;
            JVar13.u.ptr = JVar6.ptr;
            BVar2 = js_strict_eq2(ctx,JVar12,JVar13,JS_EQ_SAME_VALUE_ZERO);
            if (BVar2 != 0) goto LAB_0012caae;
            piVar8 = piVar8 + 2;
            lVar5 = lVar5 + -1;
            uVar9 = local_40;
          } while (lVar5 != 0);
        }
      }
      local_50 = uVar9;
      if ((long)local_50 < (long)local_48) {
        JVar6.float64 = 0.0;
        uVar9 = local_50;
        do {
          JVar12 = JS_GetPropertyInt64(ctx,JVar11,uVar9);
          if ((int)JVar12.tag == 6) goto LAB_0012c912;
          JVar13 = *argv;
          if (0xfffffff4 < (uint)argv->tag) {
            *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
          }
          BVar2 = js_strict_eq2(ctx,JVar13,JVar12,JS_EQ_SAME_VALUE_ZERO);
          if (BVar2 != 0) goto LAB_0012caae;
          uVar9 = uVar9 + 1;
        } while (local_48 != uVar9);
        goto LAB_0012ca70;
      }
    }
    JVar6.float64 = 0.0;
    goto LAB_0012ca70;
  }
LAB_0012c912:
  if (uVar10 < 0xfffffff5) {
    iVar7 = 6;
    JVar6.float64 = 0.0;
    goto LAB_0012ca99;
  }
  iVar1 = *JVar3.ptr;
  *(int *)JVar3.ptr = iVar1 + -1;
  iVar7 = 6;
  JVar6.float64 = 0.0;
  goto joined_r0x0012ca88;
LAB_0012caae:
  JVar6.float64 = 4.94065645841247e-324;
LAB_0012ca70:
  iVar7 = 1;
  if (uVar10 < 0xfffffff5) goto LAB_0012ca99;
  iVar1 = *JVar3.ptr;
  *(int *)JVar3.ptr = iVar1 + -1;
joined_r0x0012ca88:
  if (iVar1 < 2) {
    __JS_FreeValueRT(ctx->rt,JVar11);
  }
LAB_0012ca99:
  JVar11.tag = iVar7;
  JVar11.u.float64 = JVar6.float64;
  return JVar11;
}

Assistant:

static JSValue js_array_includes(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue obj, val;
    int64_t len, n, res;
    JSValue *arrp;
    uint32_t count;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    res = FALSE;
    if (len > 0) {
        n = 0;
        if (argc > 1) {
            if (JS_ToInt64Clamp(ctx, &n, argv[1], 0, len, len))
                goto exception;
        }
        if (js_get_fast_array(ctx, obj, &arrp, &count)) {
            for (; n < count; n++) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]),
                                  JS_DupValue(ctx, arrp[n]),
                                  JS_EQ_SAME_VALUE_ZERO)) {
                    res = TRUE;
                    goto done;
                }
            }
        }
        for (; n < len; n++) {
            val = JS_GetPropertyInt64(ctx, obj, n);
            if (JS_IsException(val))
                goto exception;
            if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]), val,
                              JS_EQ_SAME_VALUE_ZERO)) {
                res = TRUE;
                break;
            }
        }
    }
 done:
    JS_FreeValue(ctx, obj);
    return JS_NewBool(ctx, res);

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}